

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::If_AST_Node::eval_internal(If_AST_Node *this,Dispatch_State *t_ss)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar5;
  size_t i;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  Dispatch_State *t_e;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Boxed_Value *in_stack_ffffffffffffffb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  Dispatch_State local_28;
  
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),0);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26c0be);
  t_e = &local_28;
  AST_Node::eval((AST_Node *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),t_e);
  bVar1 = AST_Node::get_bool_condition(in_stack_ffffffffffffffb0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x26c0f2);
  if ((bVar1 & 1) == 0) {
    sVar3 = std::
            vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)(in_RSI + 0x60));
    if (2 < sVar3) {
      for (local_40._M_allocated_capacity = 2;
          sVar3 = std::
                  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                          *)(in_RSI + 0x60)), local_40._M_allocated_capacity < sVar3;
          local_40._M_allocated_capacity = local_40._M_allocated_capacity + 3) {
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)(in_RSI + 0x60),local_40._M_allocated_capacity);
        std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x26c1b3);
        bVar2 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (bVar2) {
          std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0x60),local_40._M_allocated_capacity + 1);
          std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x26c1eb);
          BVar5 = AST_Node::eval((AST_Node *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),t_e);
          _Var4._M_pi = BVar5.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          goto LAB_0026c30d;
        }
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)(in_RSI + 0x60),local_40._M_allocated_capacity);
        std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x26c220);
        bVar2 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (bVar2) {
          std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                        *)(in_RSI + 0x60),local_40._M_allocated_capacity + 1);
          std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x26c25a);
          in_stack_ffffffffffffff70 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0;
          AST_Node::eval((AST_Node *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),t_e);
          bVar2 = AST_Node::get_bool_condition(in_stack_ffffffffffffffb0);
          Boxed_Value::~Boxed_Value((Boxed_Value *)0x26c28e);
          if (bVar2) {
            std::
            vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                          *)(in_RSI + 0x60),local_40._M_allocated_capacity + 2);
            std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x26c2b7);
            BVar5 = AST_Node::eval((AST_Node *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),t_e);
            _Var4._M_pi = BVar5.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            goto LAB_0026c30d;
          }
        }
      }
    }
    Boxed_Value::Boxed_Value((Boxed_Value *)0x26c30d);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),1);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26c117);
    BVar5 = AST_Node::eval((AST_Node *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),t_e);
    _Var4._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_0026c30d:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{

          if (get_bool_condition(children[0]->eval(t_ss))) {
            return children[1]->eval(t_ss);
          } else {
            if (children.size() > 2) {
              size_t i = 2;
              while (i < children.size()) {
                if (children[i]->text == "else") {
                  return children[i+1]->eval(t_ss);
                }
                else if (children[i]->text == "else if") {
                  if (get_bool_condition(children[i+1]->eval(t_ss))) {
                    return children[i+2]->eval(t_ss);
                  }
                }
                i += 3;
              }
            }
          }

          return Boxed_Value();
        }